

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

QString * __thiscall QtCbor::ByteData::toUtf8String(QString *__return_storage_ptr__,ByteData *this)

{
  qsizetype in_RCX;
  
  QString::fromUtf8(__return_storage_ptr__,(QString *)(this + 1),(char *)this->len,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

QString toUtf8String() const    { return QString::fromUtf8(byte(), len); }